

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_large.c
# Opt level: O3

void verify_large_zip(archive *a,fileblocks *fileblocks)

{
  longlong v1;
  archive *paVar1;
  wchar_t wVar2;
  int iVar3;
  char *pcVar4;
  int64_t v2;
  int64_t *piVar5;
  ulong uVar6;
  archive_entry *ae;
  char namebuff [64];
  archive_entry *local_88;
  archive *local_80;
  char local_78 [72];
  
  wVar2 = archive_read_set_options(a,"zip:ignorecrc32");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ę',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_set_options(a, \"zip:ignorecrc32\")",a);
  iVar3 = archive_read_set_open_callback(a,memory_read_open);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ě',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_read_set_open_callback(a, memory_read_open)",a);
  iVar3 = archive_read_set_read_callback(a,memory_read);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ĝ',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_read_set_read_callback(a, memory_read)",a);
  iVar3 = archive_read_set_skip_callback(a,memory_read_skip);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ğ',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_read_set_skip_callback(a, memory_read_skip)",a);
  iVar3 = archive_read_set_seek_callback(a,memory_read_seek);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ġ',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_read_set_seek_callback(a, memory_read_seek)",a);
  iVar3 = archive_read_set_callback_data(a,fileblocks);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ģ',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_read_set_callback_data(a, fileblocks)",a);
  iVar3 = archive_read_open1(a);
  local_80 = a;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ģ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_open1(a)",a);
  piVar5 = test_sizes;
  uVar6 = 0;
  do {
    paVar1 = local_80;
    iVar3 = archive_read_next_header(local_80,&local_88);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                        ,L'Ī',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar1)
    ;
    sprintf(local_78,"file_%d",uVar6 & 0xffffffff);
    pcVar4 = archive_entry_pathname(local_88);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
               ,L'Ĭ',local_78,"namebuff",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    v1 = *piVar5;
    v2 = archive_entry_size(local_88);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                        ,L'ĭ',v1,"test_sizes[i]",v2,"archive_entry_size(ae)",(void *)0x0);
    paVar1 = local_80;
    uVar6 = uVar6 + 1;
    piVar5 = piVar5 + 1;
  } while (uVar6 != 0x10);
  iVar3 = archive_read_next_header(local_80,&local_88);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'į',0,"0",(long)iVar3,"archive_read_next_header(a, &ae)",paVar1);
  pcVar4 = archive_entry_pathname(local_88);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
             ,L'İ',"lastfile","\"lastfile\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
  ;
  iVar3 = archive_read_next_header(paVar1,&local_88);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ĳ',1,"ARCHIVE_EOF",(long)iVar3,"archive_read_next_header(a, &ae)",paVar1);
  iVar3 = archive_read_close(paVar1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ĵ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",paVar1);
  return;
}

Assistant:

static void
verify_large_zip(struct archive *a, struct fileblocks *fileblocks)
{
	char namebuff[64];
	struct archive_entry *ae;
	int i;

	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_options(a, "zip:ignorecrc32"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_open_callback(a, memory_read_open));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_read_callback(a, memory_read));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_skip_callback(a, memory_read_skip));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_seek_callback(a, memory_read_seek));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_callback_data(a, fileblocks));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open1(a));

	/*
	 * Read entries back.
	 */
	for (i = 0; test_sizes[i] > 0; i++) {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));
		sprintf(namebuff, "file_%d", i);
		assertEqualString(namebuff, archive_entry_pathname(ae));
		assertEqualInt(test_sizes[i], archive_entry_size(ae));
	}
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualString("lastfile", archive_entry_pathname(ae));

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
}